

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetFixingDate
          (FXBase *this,string *fixing_key,Date *date)

{
  FX *pFVar1;
  string local_38;
  
  pFVar1 = this->outer_class_;
  tools::Date::ToString_abi_cxx11_(&local_38,date);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,fixing_key,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetFixingDate(const std::string& fixing_key, Date* date)
{
    outer_class_.subject_builder_.SetComponent(fixing_key, date->ToString());
}